

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty_pty(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  undefined8 uVar2;
  char *pcVar3;
  int slave_fd;
  int master_fd;
  winsize w;
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    iVar1 = openpty(&master_fd,&slave_fd,0,0,&w);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s\n","No pty available, skipping.");
      fflush(_stderr);
      return 1;
    }
    iVar1 = uv_tty_init(&loop,&slave_tty,slave_fd,0);
    if (iVar1 == 0) {
      iVar1 = uv_tty_init(&loop,&master_tty,master_fd,0);
      if (iVar1 == 0) {
        iVar1 = uv_is_readable(&slave_tty);
        if (iVar1 == 0) {
          pcVar3 = "uv_is_readable((uv_stream_t*) &slave_tty)";
          uVar2 = 0x1c5;
        }
        else {
          iVar1 = uv_is_writable(&slave_tty);
          if (iVar1 == 0) {
            pcVar3 = "uv_is_writable((uv_stream_t*) &slave_tty)";
            uVar2 = 0x1c6;
          }
          else {
            iVar1 = uv_is_readable(&master_tty);
            if (iVar1 == 0) {
              pcVar3 = "uv_is_readable((uv_stream_t*) &master_tty)";
              uVar2 = 0x1c7;
            }
            else {
              iVar1 = uv_is_writable(&master_tty);
              if (iVar1 == 0) {
                pcVar3 = "uv_is_writable((uv_stream_t*) &master_tty)";
                uVar2 = 0x1c8;
              }
              else if ((slave_tty.flags._2_1_ & 0x10) == 0) {
                if ((master_tty.flags._2_1_ & 0x10) == 0) {
                  pcVar3 = "master_tty.flags & 0x100000";
                  uVar2 = 0x1cf;
                }
                else {
                  iVar1 = close(slave_fd);
                  if (iVar1 == 0) {
                    uv_close(&slave_tty,0);
                    iVar1 = close(master_fd);
                    if (iVar1 == 0) {
                      uv_close(&master_tty,0);
                      iVar1 = uv_run(&loop,0);
                      if (iVar1 == 0) {
                        loop_00 = (uv_loop_t *)uv_default_loop();
                        close_loop(loop_00);
                        uVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar2);
                        if (iVar1 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uVar2 = 0x1d7;
                      }
                      else {
                        pcVar3 = "0 == uv_run(&loop, UV_RUN_DEFAULT)";
                        uVar2 = 0x1d5;
                      }
                    }
                    else {
                      pcVar3 = "0 == close(master_fd)";
                      uVar2 = 0x1d2;
                    }
                  }
                  else {
                    pcVar3 = "0 == close(slave_fd)";
                    uVar2 = 0x1d0;
                  }
                }
              }
              else {
                pcVar3 = "0 == (slave_tty.flags & 0x100000)";
                uVar2 = 0x1cc;
              }
            }
          }
        }
      }
      else {
        pcVar3 = "0 == uv_tty_init(&loop, &master_tty, master_fd, 0)";
        uVar2 = 0x1c4;
      }
    }
    else {
      pcVar3 = "0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0)";
      uVar2 = 0x1c3;
    }
  }
  else {
    pcVar3 = "0 == uv_loop_init(&loop)";
    uVar2 = 0x1bd;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tty_pty) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif

#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    defined(__FreeBSD_kernel__)                   || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT(0 == uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT(0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT(0 == uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT(0 == (slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT(0 == close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT(0 == close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}